

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O1

string * __thiscall
cfd::js::api::json::ConvertMnemonicToSeedRequest::GetLanguageString_abi_cxx11_
          (string *__return_storage_ptr__,ConvertMnemonicToSeedRequest *this,
          ConvertMnemonicToSeedRequest *obj)

{
  pointer pcVar1;
  UniValue json_value;
  string local_90;
  UniValue local_70;
  
  pcVar1 = (this->language_)._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (this->language_)._M_string_length);
  UniValue::UniValue(&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  UniValue::write_abi_cxx11_((uint)__return_storage_ptr__,(uint)&local_70);
  UniValue::~UniValue(&local_70);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetLanguageString(  // line separate
      const ConvertMnemonicToSeedRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.language_);
  }